

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<PerfEvent>::relocate
          (QArrayDataPointer<PerfEvent> *this,qsizetype offset,PerfEvent **data)

{
  bool bVar1;
  PerfEvent *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  PerfEvent *res;
  
  first = (PerfEvent *)(*(long *)(in_RDI + 8) + in_RSI * 0x10);
  QtPrivate::q_relocate_overlap_n<PerfEvent,long_long>(first,in_RDI,(PerfEvent *)0x1271d7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<PerfEvent>,PerfEvent_const*>
                        (data,(QArrayDataPointer<PerfEvent> *)res), bVar1)) {
    *in_RDX = in_RSI * 0x10 + *in_RDX;
  }
  *(PerfEvent **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }